

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  byte bVar1;
  byte *pbVar2;
  ExprList *pEVar3;
  KeyInfo *pKVar4;
  u8 uVar5;
  undefined1 uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Vdbe *p;
  Expr *pEVar11;
  Select *pSVar12;
  CollSeq *pCVar13;
  Expr *pLeft;
  uint p2;
  Op *pOVar14;
  char *pcVar15;
  Select **ppSVar16;
  int op;
  uint N;
  ulong uVar17;
  int iVar18;
  ExprList_item *pEVar19;
  int iValToIns;
  uint local_94;
  char local_8d;
  int local_8c;
  Expr *local_88;
  int local_7c;
  Expr *local_78;
  KeyInfo *local_70;
  ulong local_68;
  Walker local_60;
  
  local_68 = CONCAT44(local_68._4_4_,isRowid);
  p = pParse->pVdbe;
  if ((p == (Vdbe *)0x0) && (p = allocVdbe(pParse), p == (Vdbe *)0x0)) {
    return 0;
  }
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  local_94 = 0xffffffff;
  if ((pExpr->flags & 0x20) == 0) {
    local_94 = sqlite3VdbeAddOp3(p,0x14,0,0,0);
  }
  if (pParse->explain == '\x02') {
    pcVar15 = "CORRELATED ";
    if (-1 < (int)local_94) {
      pcVar15 = "";
    }
    pcVar15 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar15);
    iVar8 = sqlite3VdbeAddOp3(p,0xa7,pParse->iSelectId,0,0);
    sqlite3VdbeChangeP4(p,iVar8,pcVar15,-7);
  }
  uVar5 = pExpr->op;
  local_78 = pExpr;
  if (uVar5 != 'J') {
    pSVar12 = (pExpr->x).pSelect;
    iVar8 = 1;
    if (uVar5 == 'w') {
      iVar8 = pSVar12->pEList->nExpr;
    }
    local_60.pParse._4_4_ = pParse->nMem + 1;
    iVar18 = pParse->nMem + iVar8;
    local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
    local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    pParse->nMem = iVar18;
    if (uVar5 == 'w') {
      local_60.xExprCallback =
           (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iVar8,local_60.pParse._4_4_);
      sqlite3VdbeAddOp3(p,0x3b,0,local_60.pParse._4_4_,iVar18);
      uVar6 = 10;
    }
    else {
      sqlite3VdbeAddOp3(p,0x38,0,local_60.pParse._4_4_,0);
      uVar6 = 3;
    }
    local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,uVar6);
    if (pSVar12->pLimit != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pSVar12->pLimit);
    }
    pEVar11 = sqlite3ExprAlloc(pParse->db,0x86,sqlite3IntTokens + 1,0);
    pSVar12->pLimit = pEVar11;
    pSVar12->iLimit = 0;
    pbVar2 = (byte *)((long)&pSVar12->selFlags + 1);
    *pbVar2 = *pbVar2 & 0xfb;
    iVar18 = sqlite3Select(pParse,pSVar12,(SelectDest *)&local_60);
    iVar8 = local_60.pParse._4_4_;
    if (iVar18 != 0) {
      return 0;
    }
    goto LAB_00231be9;
  }
  local_88 = pExpr->pLeft;
  uVar5 = local_88->op;
  if (uVar5 == 0x9d) {
    uVar5 = local_88->op2;
  }
  if (uVar5 == 'w') {
    pSVar12 = (local_88->x).pSelect;
LAB_00231851:
    N = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
  }
  else {
    N = 1;
    if (uVar5 == 0x9e) {
      pSVar12 = (Select *)&local_88->x;
      goto LAB_00231851;
    }
  }
  iVar8 = pParse->nTab;
  pParse->nTab = iVar8 + 1;
  pExpr->iTable = iVar8;
  local_70 = (KeyInfo *)0x0;
  iVar18 = (int)local_68;
  p2 = 0;
  if ((int)local_68 == 0) {
    p2 = N;
  }
  iVar9 = sqlite3VdbeAddOp3(p,0x6c,iVar8,p2,0);
  if (iVar18 == 0) {
    local_70 = sqlite3KeyInfoAlloc(pParse->db,N,1);
  }
  pSVar12 = (Select *)(pExpr->x).pList;
  if ((pExpr->flags & 0x800) == 0) {
    if (pSVar12 != (Select *)0x0) {
      cVar7 = sqlite3ExprAffinity(local_88);
      pKVar4 = local_70;
      local_8d = 'A';
      if (cVar7 != '\0') {
        local_8d = cVar7;
      }
      if (local_70 != (KeyInfo *)0x0) {
        pCVar13 = sqlite3ExprCollSeq(pParse,local_78->pLeft);
        pKVar4->aColl[0] = pCVar13;
      }
      uVar5 = pParse->nTempReg;
      if (uVar5 == '\0') {
        iVar8 = pParse->nMem + 1;
        local_88 = (Expr *)CONCAT44(local_88._4_4_,iVar8);
        pParse->nMem = iVar8;
LAB_002319f5:
        iVar8 = pParse->nMem + 1;
        pParse->nMem = iVar8;
      }
      else {
        bVar1 = uVar5 - 1;
        pParse->nTempReg = bVar1;
        local_88 = (Expr *)CONCAT44(local_88._4_4_,pParse->aTempReg[bVar1]);
        if (bVar1 == 0) goto LAB_002319f5;
        pParse->nTempReg = uVar5 - 2;
        iVar8 = pParse->aTempReg[(byte)(uVar5 - 2)];
      }
      local_8c = rHasNullFlag;
      local_7c = iVar9;
      if ((int)local_68 != 0) {
        sqlite3VdbeAddOp3(p,0x3b,0,iVar8,0);
      }
      if (0 < *(int *)&pSVar12->pEList) {
        ppSVar16 = (Select **)&pSVar12->op;
        iVar18 = *(int *)&pSVar12->pEList + 1;
        do {
          pEVar11 = (Expr *)*ppSVar16;
          if (-1 < (int)local_94) {
            local_60.eCode = '\x01';
            local_60.xExprCallback = exprNodeIsConstant;
            local_60.xSelectCallback = selectNodeIsConstant;
            local_60.u.n = 0;
            if ((pEVar11 != (Expr *)0x0) && (walkExpr(&local_60,pEVar11), local_60.eCode == '\0')) {
              sqlite3VdbeChangeToNoop(p,local_94);
              local_94 = 0xffffffff;
            }
          }
          if ((int)local_68 == 0) {
            iVar9 = sqlite3ExprCodeTarget(pParse,pEVar11,(int)local_88);
            iVar10 = sqlite3VdbeAddOp3(p,99,iVar9,1,iVar8);
            sqlite3VdbeChangeP4(p,iVar10,&local_8d,1);
            sqlite3ExprCacheRemove(pParse,iVar9,1);
            iVar9 = sqlite3VdbeAddOp3(p,0x7e,local_78->iTable,iVar8,iVar9);
            if (p->db->mallocFailed == '\0') {
              pOVar14 = p->aOp;
              pOVar14[iVar9].p4type = -3;
              pOVar14[iVar9].p4.i = 1;
            }
          }
          else {
            iVar9 = sqlite3ExprIsInteger(pEVar11,(int *)&local_60);
            if (iVar9 == 0) {
              iVar10 = sqlite3ExprCodeTarget(pParse,pEVar11,(int)local_88);
              sqlite3VdbeAddOp3(p,0x11,iVar10,p->nOp + 2,0);
              iVar9 = local_78->iTable;
              op = 0x74;
            }
            else {
              iVar9 = local_78->iTable;
              op = 0x75;
              iVar10 = (int)local_60.pParse;
            }
            sqlite3VdbeAddOp3(p,op,iVar9,iVar8,iVar10);
          }
          ppSVar16 = ppSVar16 + 4;
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      }
      sqlite3ReleaseTempReg(pParse,(int)local_88);
      sqlite3ReleaseTempReg(pParse,iVar8);
      rHasNullFlag = local_8c;
      iVar9 = local_7c;
    }
  }
  else {
    pEVar3 = pSVar12->pEList;
    local_8c = rHasNullFlag;
    if (pEVar3->nExpr == N) {
      local_60.pParse._4_4_ = local_78->iTable;
      local_60.pParse._0_4_ = CONCAT31(local_60.pParse._1_3_,0xb);
      local_60.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_7c = iVar9;
      local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_78);
      pSVar12->iLimit = 0;
      iVar8 = sqlite3Select(pParse,pSVar12,(SelectDest *)&local_60);
      if (iVar8 != 0) {
        if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
          sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
        }
        if ((local_70 != (KeyInfo *)0x0) &&
           (local_70->nRef = local_70->nRef - 1, local_70->nRef == 0)) {
          sqlite3DbFreeNN(local_70->db,local_70);
        }
        return 0;
      }
      if (local_60.xSelectCallback != (_func_int_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_60.xSelectCallback);
      }
      pKVar4 = local_70;
      pEVar11 = local_88;
      rHasNullFlag = local_8c;
      iVar9 = local_7c;
      if (0 < (int)N) {
        pEVar19 = pEVar3->a;
        local_68 = (ulong)N;
        uVar17 = 0;
        do {
          pLeft = sqlite3VectorFieldSubexpr(pEVar11,(int)uVar17);
          pCVar13 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar19->pExpr);
          pKVar4->aColl[uVar17] = pCVar13;
          uVar17 = uVar17 + 1;
          pEVar19 = pEVar19 + 1;
          rHasNullFlag = local_8c;
          iVar9 = local_7c;
        } while (local_68 != uVar17);
      }
    }
  }
  iVar8 = 0;
  if (local_70 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p,iVar9,(char *)local_70,-9);
  }
LAB_00231be9:
  if (rHasNullFlag != 0) {
    sqlite3SetHasNullFlag(p,local_78->iTable,rHasNullFlag);
  }
  if (-1 < (int)local_94) {
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp + local_94;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
  }
  sqlite3ExprCachePop(pParse);
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(pParse->db, "EXECUTE %s%s SUBQUERY %d",
        jmpIfDynamic>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR",
        pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,
                                  &sqlite3IntTokens[1], 0);
      pSel->iLimit = 0;
      pSel->selFlags &= ~SF_MultiValue;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }
  sqlite3ExprCachePop(pParse);

  return rReg;
}